

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Stats::getArrayError
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Stats *this,int index)

{
  pointer pSVar1;
  iterator __position;
  bool bVar2;
  pointer ppBVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  RealType v;
  double local_38;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar1 = (this->data_).
           super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppBVar3 = *(pointer *)
             &pSVar1[index].accumulatorArray2d.
              super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
              ._M_impl;
  if (*(pointer *)
       ((long)&pSVar1[index].accumulatorArray2d.
               super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
               ._M_impl + 8) != ppBVar3) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      lVar4 = __dynamic_cast(ppBVar3[uVar5],&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      dVar7 = *(double *)(lVar4 + 0x20) - *(double *)(lVar4 + 0x18) * *(double *)(lVar4 + 0x18);
      dVar8 = 0.0;
      if (0.0 <= dVar7) {
        dVar8 = dVar7;
      }
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      dVar7 = ((double)CONCAT44(0x45300000,(int)((ulong)*(undefined8 *)(lVar4 + 8) >> 0x20)) -
              1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)*(undefined8 *)(lVar4 + 8)) - 4503599627370496.0);
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      local_38 = (dVar8 * 1.96) / dVar7;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                   &local_38);
      }
      else {
        *__position._M_current = local_38;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pSVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppBVar3 = *(pointer *)
                 &pSVar1[index].accumulatorArray2d.
                  super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
                  ._M_impl;
      bVar2 = uVar6 < (ulong)((long)*(pointer *)
                                     ((long)&pSVar1[index].accumulatorArray2d.
                                             super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
                                             ._M_impl + 8) - (long)ppBVar3 >> 3);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> Stats::getArrayError(int index) {
    assert(index >= 0 && index < ENDINDEX);
    std::vector<RealType> value;
    RealType v;
    for (unsigned int i = 0; i < data_[index].accumulatorArray2d.size(); ++i) {
      dynamic_cast<Accumulator*>(data_[index].accumulatorArray2d[i])
          ->get95percentConfidenceInterval(v);
      value.push_back(v);
    }
    return value;
  }